

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JpegLibTest.cpp
# Opt level: O1

void HummusJPGSourceInitialization(j_decompress_ptr cinfo,IByteReader *inSourceStream)

{
  jpeg_source_mgr *pjVar1;
  void *pvVar2;
  
  if (cinfo->src == (jpeg_source_mgr *)0x0) {
    pjVar1 = (jpeg_source_mgr *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,0,0x48);
    cinfo->src = pjVar1;
    pvVar2 = (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,0,0x1000);
    pjVar1[1].bytes_in_buffer = (size_t)pvVar2;
  }
  pjVar1 = cinfo->src;
  pjVar1->init_source = HummusNoOp;
  pjVar1->fill_input_buffer = HummusFillInputBuffer;
  pjVar1->skip_input_data = HummusSkipInputData;
  pjVar1->resync_to_restart = jpeg_resync_to_restart;
  pjVar1->term_source = HummusNoOp;
  pjVar1[1].next_input_byte = (JOCTET *)inSourceStream;
  pjVar1->next_input_byte = (JOCTET *)0x0;
  pjVar1->bytes_in_buffer = 0;
  return;
}

Assistant:

HummusJPGSourceInitialization (j_decompress_ptr cinfo, IByteReader * inSourceStream)
{
    HummusSourceManager* src;
    
    /* The source object and input buffer are made permanent so that a series
     * of JPEG images can be read from the same file by calling jpeg_stdio_src
     * only before the first one.  (If we discarded the buffer at the end of
     * one image, we'd likely lose the start of the next one.)
     * This makes it unsafe to use this manager and a different source
     * manager serially with the same JPEG object.  Caveat programmer.
     */
    if (cinfo->src == NULL) {	/* first time for this JPEG object? */
        cinfo->src = (struct jpeg_source_mgr *)
        (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_PERMANENT,
                                    sizeof(HummusSourceManager));
        src = (HummusSourceManager*) cinfo->src;
        src->buffer = (JOCTET *)
        (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_PERMANENT,
                                    INPUT_BUF_SIZE * sizeof(JOCTET));
    }
    
    src = (HummusSourceManager*) cinfo->src;
    src->pub.init_source = HummusNoOp;
    src->pub.fill_input_buffer = HummusFillInputBuffer;
    src->pub.skip_input_data = HummusSkipInputData;
    src->pub.resync_to_restart = jpeg_resync_to_restart; /* use default method */
    src->pub.term_source = HummusNoOp;
    src->mReader = inSourceStream;
    src->pub.bytes_in_buffer = 0; /* forces fill_input_buffer on first read */
    src->pub.next_input_byte = NULL; /* until buffer loaded */
}